

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O1

void out_AddSection(Section *section)

{
  uint uVar1;
  SectionType SVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  SortedSections *pSVar6;
  SortedSection *pSVar7;
  SortedSections *pSVar8;
  SortedSection *pSVar9;
  SortedSection *pSVar10;
  uint uVar11;
  
  SVar2 = section->type;
  uVar3 = section->bank;
  uVar4 = sectionTypeInfo[SVar2].firstBank;
  uVar11 = uVar3 - uVar4;
  uVar1 = uVar11 + 1;
  if (out_AddSection::maxNbBanks[SVar2] < uVar1) {
    errx("Section \"%s\" has an invalid bank range (%u > %u)",section->name,(ulong)uVar3,
         (ulong)(out_AddSection::maxNbBanks[SVar2] - 1));
  }
  if (sections[SVar2].nbBanks < uVar1) {
    pSVar6 = (SortedSections *)realloc(sections[SVar2].banks,(ulong)uVar1 << 4);
    SVar2 = section->type;
    sections[SVar2].banks = pSVar6;
    uVar5 = sections[SVar2].nbBanks;
    if (uVar5 < uVar1) {
      memset(pSVar6 + uVar5,0,(ulong)(uVar3 - (uVar4 + uVar5)) * 0x10 + 0x10);
    }
    sections[SVar2].nbBanks = uVar1;
  }
  pSVar6 = sections[section->type].banks;
  if (pSVar6 == (SortedSections *)0x0) {
    err("Failed to realloc banks");
  }
  pSVar7 = (SortedSection *)malloc(0x10);
  if (pSVar7 == (SortedSection *)0x0) {
    err("Failed to add new section \"%s\"",section->name);
  }
  pSVar8 = (SortedSections *)&pSVar6->zeroLenSections;
  if (section->size != 0) {
    pSVar8 = pSVar6;
  }
  pSVar8 = pSVar8 + uVar11;
  pSVar7->section = section;
  pSVar10 = pSVar8->sections;
  if ((pSVar10 != (SortedSection *)0x0) && (pSVar10->section->org < section->org)) {
    do {
      pSVar9 = pSVar10;
      pSVar10 = pSVar9->next;
      if (pSVar10 == (SortedSection *)0x0) break;
    } while (pSVar10->section->org < section->org);
    pSVar8 = (SortedSections *)&pSVar9->next;
  }
  pSVar7->next = pSVar10;
  pSVar8->sections = pSVar7;
  return;
}

Assistant:

void out_AddSection(struct Section const *section)
{
	static uint32_t maxNbBanks[] = {
		AT(SECTTYPE_WRAM0) 1,
		AT(SECTTYPE_VRAM)  2,
		AT(SECTTYPE_ROMX)  UINT32_MAX,
		AT(SECTTYPE_ROM0)  1,
		AT(SECTTYPE_HRAM)  1,
		AT(SECTTYPE_WRAMX) 7,
		AT(SECTTYPE_SRAM)  UINT32_MAX,
		AT(SECTTYPE_OAM)   1,
	};

	uint32_t targetBank = section->bank - sectionTypeInfo[section->type].firstBank;
	uint32_t minNbBanks = targetBank + 1;

	if (minNbBanks > maxNbBanks[section->type])
		errx("Section \"%s\" has an invalid bank range (%" PRIu32 " > %" PRIu32 ")",
		     section->name, section->bank,
		     maxNbBanks[section->type] - 1);

	if (minNbBanks > sections[section->type].nbBanks) {
		sections[section->type].banks =
			(struct SortedSections *)realloc(sections[section->type].banks,
				sizeof(*sections[0].banks) * minNbBanks);
		for (uint32_t i = sections[section->type].nbBanks; i < minNbBanks; i++) {
			sections[section->type].banks[i].sections = NULL;
			sections[section->type].banks[i].zeroLenSections = NULL;
		}
		sections[section->type].nbBanks = minNbBanks;
	}
	if (!sections[section->type].banks)
		err("Failed to realloc banks");

	struct SortedSection *newSection = (struct SortedSection *)malloc(sizeof(*newSection));
	struct SortedSection **ptr = section->size
		? &sections[section->type].banks[targetBank].sections
		: &sections[section->type].banks[targetBank].zeroLenSections;

	if (!newSection)
		err("Failed to add new section \"%s\"", section->name);
	newSection->section = section;

	while (*ptr && (*ptr)->section->org < section->org)
		ptr = &(*ptr)->next;

	newSection->next = *ptr;
	*ptr = newSection;
}